

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Generators::GeneratorUntypedBase::countedNext(GeneratorUntypedBase *this)

{
  byte bVar1;
  undefined8 *in_RDI;
  bool ret;
  
  bVar1 = (**(code **)*in_RDI)();
  if ((bool)(bVar1 & 1) != false) {
    std::__cxx11::string::clear();
    in_RDI[5] = in_RDI[5] + 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool GeneratorUntypedBase::countedNext() {
            auto ret = next();
            if ( ret ) {
                m_stringReprCache.clear();
                ++m_currentElementIndex;
            }
            return ret;
        }